

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

void * index234(tree234 *t,int index)

{
  int iVar1;
  node234_conflict *local_28;
  node234_conflict *n;
  int index_local;
  tree234 *t_local;
  
  if (((t->root != (node234_conflict *)0x0) && (-1 < index)) &&
     (iVar1 = countnode234(t->root), index < iVar1)) {
    local_28 = t->root;
    n._4_4_ = index;
    while (local_28 != (node234_conflict *)0x0) {
      if (n._4_4_ < local_28->counts[0]) {
        local_28 = local_28->kids[0];
      }
      else {
        n._4_4_ = n._4_4_ - (local_28->counts[0] + 1);
        if (n._4_4_ < 0) {
          return local_28->elems[0];
        }
        if (n._4_4_ < local_28->counts[1]) {
          local_28 = local_28->kids[1];
        }
        else {
          n._4_4_ = n._4_4_ - (local_28->counts[1] + 1);
          if (n._4_4_ < 0) {
            return local_28->elems[1];
          }
          if (n._4_4_ < local_28->counts[2]) {
            local_28 = local_28->kids[2];
          }
          else {
            n._4_4_ = n._4_4_ - (local_28->counts[2] + 1);
            if (n._4_4_ < 0) {
              return local_28->elems[2];
            }
            local_28 = local_28->kids[3];
          }
        }
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *index234(tree234 * t, int index)
{
    node234 *n;

    if (!t->root)
        return NULL;                   /* tree is empty */

    if (index < 0 || index >= countnode234(t->root))
        return NULL;                   /* out of range */

    n = t->root;

    while (n) {
        if (index < n->counts[0])
            n = n->kids[0];
        else if (index -= n->counts[0] + 1, index < 0)
            return n->elems[0];
        else if (index < n->counts[1])
            n = n->kids[1];
        else if (index -= n->counts[1] + 1, index < 0)
            return n->elems[1];
        else if (index < n->counts[2])
            n = n->kids[2];
        else if (index -= n->counts[2] + 1, index < 0)
            return n->elems[2];
        else
            n = n->kids[3];
    }

    /* We shouldn't ever get here. I wonder how we did. */
    return NULL;
}